

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_unnest_expression.cpp
# Opt level: O2

bool __thiscall
duckdb::BoundUnnestExpression::Equals(BoundUnnestExpression *this,BaseExpression *other_p)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  BoundUnnestExpression *pBVar3;
  type pEVar4;
  type pEVar5;
  undefined8 extraout_RDX;
  
  bVar1 = Expression::Equals(&this->super_Expression,other_p);
  if (bVar1) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundUnnestExpression>(other_p);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this->child);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar3->child);
    UNRECOVERED_JUMPTABLE = (pEVar4->super_BaseExpression)._vptr_BaseExpression[10];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar4,pEVar5,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool BoundUnnestExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundUnnestExpression>();
	if (!Expression::Equals(*child, *other.child)) {
		return false;
	}
	return true;
}